

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

int Prs_ManUtilSkipSpaces(Prs_Man_t *p)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  
  pbVar1 = (byte *)p->pLimit;
  pbVar2 = (byte *)p->pCur;
  do {
    if (pbVar1 <= pbVar2) {
LAB_003be023:
      if (p->ErrorStr[0] == '\0') {
        builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
        return 1;
      }
      __assert_fail("!p->ErrorStr[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaPrs.h"
                    ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
    }
    while( true ) {
      uVar3 = (ulong)*pbVar2;
      if (0x2f < uVar3) {
        return 0;
      }
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
      pbVar2 = pbVar2 + 1;
      p->pCur = (char *)pbVar2;
    }
    if (uVar3 != 0x2f) {
      if (uVar3 != 0) {
        return 0;
      }
      goto LAB_003be023;
    }
    if (pbVar2[1] == 0x2a) {
      pbVar2 = pbVar2 + 2;
      p->pCur = (char *)pbVar2;
      if (pbVar1 <= pbVar2) {
        return 0;
      }
      while ((*pbVar2 != 0x2a || (pbVar2[1] != 0x2f))) {
        pbVar2 = pbVar2 + 1;
        p->pCur = (char *)pbVar2;
        if (pbVar2 == pbVar1) {
          return 0;
        }
      }
      pbVar2 = pbVar2 + 2;
    }
    else {
      if (pbVar2[1] != 0x2f) {
        return 0;
      }
      pbVar2 = pbVar2 + 2;
      p->pCur = (char *)pbVar2;
      if (pbVar1 <= pbVar2) {
        return 0;
      }
      while (*pbVar2 != 10) {
        pbVar2 = pbVar2 + 1;
        p->pCur = (char *)pbVar2;
        if (pbVar2 == pbVar1) {
          return 0;
        }
      }
      pbVar2 = pbVar2 + 1;
    }
    p->pCur = (char *)pbVar2;
  } while( true );
}

Assistant:

static inline int Prs_ManUtilSkipSpaces( Prs_Man_t * p )
{
    while ( p->pCur < p->pLimit )
    {
        while ( Prs_CharIsSpace(*p->pCur) ) 
            p->pCur++;
        if ( !*p->pCur )
            return Prs_ManErrorSet(p, "Unexpectedly reached end-of-file.", 1);
        if ( !Prs_ManUtilSkipComments(p) )
            return 0;
    }
    return Prs_ManErrorSet(p, "Unexpectedly reached end-of-file.", 1);
}